

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O3

Matrix33 * AML::operator-(Matrix33 *__return_storage_ptr__,Matrix33 *lhs,double s)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (lhs->field_0).data[2][2];
  dVar2 = (lhs->field_0).data[0][1];
  (__return_storage_ptr__->field_0).data[0][0] = (lhs->field_0).data[0][0] - s;
  (__return_storage_ptr__->field_0).data[0][1] = dVar2 - s;
  dVar2 = (lhs->field_0).data[1][0];
  (__return_storage_ptr__->field_0).data[0][2] = (lhs->field_0).data[0][2] - s;
  (__return_storage_ptr__->field_0).data[1][0] = dVar2 - s;
  dVar2 = (lhs->field_0).data[1][2];
  (__return_storage_ptr__->field_0).data[1][1] = (lhs->field_0).data[1][1] - s;
  (__return_storage_ptr__->field_0).data[1][2] = dVar2 - s;
  dVar2 = (lhs->field_0).data[2][1];
  (__return_storage_ptr__->field_0).data[2][0] = (lhs->field_0).data[2][0] - s;
  (__return_storage_ptr__->field_0).data[2][1] = dVar2 - s;
  (__return_storage_ptr__->field_0).data[2][2] = dVar1 - s;
  return __return_storage_ptr__;
}

Assistant:

Matrix33 operator-(const Matrix33& lhs, double s) { return (Matrix33(lhs) -= s); }